

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

ktx_error_code_e __thiscall
anon_unknown.dwarf_bea9::TextureWriterTestHelper<unsigned_short,_2U,_33324U>::copyImagesToTexture
          (TextureWriterTestHelper<unsigned_short,_2U,_33324U> *this,ktxTexture1 *texture)

{
  pointer pvVar1;
  long lVar2;
  ktx_error_code_e kVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
      super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
      super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    kVar3 = KTX_SUCCESS;
  }
  else {
    uVar8 = 0;
    kVar3 = KTX_SUCCESS;
    do {
      pvVar1 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
               super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar8].
                   super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) !=
          pvVar1[uVar8].
          super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar5 = 0;
        do {
          lVar2 = *(long *)&(this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                            super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          lVar4 = *(long *)(lVar2 + uVar5 * 0x18);
          if (*(long *)(lVar2 + 8 + uVar5 * 0x18) != lVar4) {
            uVar7 = 0;
            do {
              lVar2 = *(long *)(lVar4 + uVar7 * 0x18);
              kVar3 = ktxTexture1_SetImageFromMemory
                                (texture,uVar8,uVar5,uVar7,lVar2,
                                 *(long *)(lVar4 + 8 + uVar7 * 0x18) - lVar2);
              if (kVar3 != KTX_SUCCESS) break;
              uVar7 = (ulong)((int)uVar7 + 1);
              lVar2 = *(long *)&(this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                                super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              lVar4 = *(long *)(lVar2 + uVar5 * 0x18);
              uVar6 = (*(long *)(lVar2 + 8 + uVar5 * 0x18) - lVar4 >> 3) * -0x5555555555555555;
            } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
          }
          pvVar1 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                   super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar7 = ((long)*(pointer *)
                          ((long)&pvVar1[uVar8].
                                  super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar1[uVar8].
                             super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
        } while (uVar5 <= uVar7 && uVar7 - uVar5 != 0);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      uVar5 = ((long)(this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                     super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                     super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
  }
  return kVar3;
}

Assistant:

KTX_error_code
    copyImagesToTexture(ktxTexture1* texture) {
        KTX_error_code result = KTX_SUCCESS;

        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            for (ktx_uint32_t layer = 0; layer < images[level].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    ktx_size_t imageBytes = images[level][layer][faceSlice].size() * sizeof(component_type);
                    ktx_uint8_t* imageDataPtr = (ktx_uint8_t*)(images[level][layer][faceSlice].data());
                    result = ktxTexture1_SetImageFromMemory(texture,
                                                            level, layer,
                                                            faceSlice,
                                                            imageDataPtr,
                                                            imageBytes);
                   if (result != KTX_SUCCESS)
                       break;
                }
            }
        }
        return result;
    }